

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int __thiscall TPZFMatrix<long_double>::Decompose_Cholesky(TPZFMatrix<long_double> *this)

{
  int iVar1;
  size_type sVar2;
  long *in_RDI;
  int res;
  list<long,_std::allocator<long>_> fake;
  size_t in_stack_000003c8;
  char *in_stack_000003d0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_20 [32];
  
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)0x122a1b2);
  iVar1 = (**(code **)(*in_RDI + 0xc0))(in_RDI,local_20);
  sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size
                    ((list<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (sVar2 != 0) {
    pzinternal::DebugStopImpl(in_stack_000003d0,in_stack_000003c8);
  }
  std::__cxx11::list<long,_std::allocator<long>_>::~list
            ((list<long,_std::allocator<long>_> *)0x122a227);
  return iVar1;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_Cholesky(){
    std::list<int64_t> fake;
    int res = this->Decompose_Cholesky(fake);
    if(fake.size()){
        DebugStop();
    }
    return res;
}